

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O0

void __thiscall adios2::transport::FileHTTP::CheckFile(FileHTTP *this,string *hint)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d8 [28];
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  allocator<char> local_91;
  string local_90 [24];
  FileHTTP *in_stack_ffffffffffffff88;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  if (*(int *)(in_RDI + 0xf0) == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Toolkit",&local_31);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"transport::file::FilePOSIX",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"CheckFile",(allocator *)__rhs);
    SysErrMsg_abi_cxx11_(in_stack_ffffffffffffff88);
    std::operator+(__lhs,__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void FileHTTP::CheckFile(const std::string hint) const
{
    if (m_socketFileDescriptor == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "CheckFile",
                                              hint + SysErrMsg());
    }
}